

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O0

void learn_sup_adf<true>(warm_cb *data,example *ec,int ec_type)

{
  value_type peVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  long *plVar4;
  wclass *pwVar5;
  reference ppeVar6;
  label_t *plVar7;
  reference pvVar8;
  long in_RDI;
  float fVar9;
  size_t a_5;
  size_t a_4;
  multi_learner *cs_learner;
  size_t a_3;
  float weight_multiplier;
  uint32_t i;
  size_t a_2;
  vector<float,_std::allocator<float>_> old_weights;
  size_t a_1;
  size_t a;
  label **cbls;
  label **csls;
  learner<char,_char> *in_stack_00000100;
  size_t in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  value_type vVar10;
  multi_learner *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  warm_cb *in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff6c;
  warm_cb *in_stack_ffffffffffffff70;
  ulong __n;
  ulong local_88;
  ulong local_78;
  uint local_68;
  ulong local_58;
  example *in_stack_ffffffffffffffb8;
  warm_cb *in_stack_ffffffffffffffc0;
  ulong local_38;
  ulong local_30;
  
  copy_example_to_adf(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  plVar4 = (long *)(in_RDI + 0x168);
  for (local_30 = 0; local_30 < *(uint *)(in_RDI + 0xa8); local_30 = local_30 + 1) {
    uVar3 = (int)local_30 + 1;
    pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[]
                       ((v_array<COST_SENSITIVE::wclass> *)(*plVar4 + local_30 * 0x20),0);
    pwVar5->class_index = uVar3;
    in_stack_ffffffffffffff6c =
         loss_cs(in_stack_ffffffffffffff70,
                 (v_array<COST_SENSITIVE::wclass> *)CONCAT44(in_stack_ffffffffffffff6c,uVar3),
                 (uint32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[]
                       ((v_array<COST_SENSITIVE::wclass> *)(*plVar4 + local_30 * 0x20),0);
    pwVar5->x = in_stack_ffffffffffffff6c;
  }
  for (local_38 = 0; local_38 < *(uint *)(in_RDI + 0xa8); local_38 = local_38 + 1) {
    ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        ((vector<example_*,_std::allocator<example_*>_> *)(in_RDI + 0x58),local_38);
    peVar1 = *ppeVar6;
    plVar7 = (label_t *)(*(long *)(in_RDI + 0x170) + local_38 * 0x20);
    *plVar7 = (peVar1->l).multi;
    plVar7[1] = (label_t)(peVar1->l).cs.costs._end;
    plVar7[2] = (label_t)(peVar1->l).cs.costs.end_array;
    uVar2 = *(undefined4 *)((long)&peVar1->l + 0x1c);
    plVar7[3].label = *(undefined4 *)((long)&peVar1->l + 0x18);
    plVar7[3].weight = (float)uVar2;
    in_stack_ffffffffffffff60 = (warm_cb *)(*plVar4 + local_38 * 0x20);
    ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        ((vector<example_*,_std::allocator<example_*>_> *)(in_RDI + 0x58),local_38);
    peVar1 = *ppeVar6;
    (peVar1->l).multi = (label_t)(in_stack_ffffffffffffff60->cb_label).costs._begin;
    (peVar1->l).cs.costs._end = (wclass *)(in_stack_ffffffffffffff60->cb_label).costs._end;
    (peVar1->l).cs.costs.end_array = (wclass *)(in_stack_ffffffffffffff60->cb_label).costs.end_array
    ;
    (peVar1->l).cs.costs.erase_count = (in_stack_ffffffffffffff60->cb_label).costs.erase_count;
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x2a1944);
  for (local_58 = 0; local_58 < *(uint *)(in_RDI + 0xa8); local_58 = local_58 + 1) {
    std::vector<example_*,_std::allocator<example_*>_>::operator[]
              ((vector<example_*,_std::allocator<example_*>_> *)(in_RDI + 0x58),local_58);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff50,
               (value_type_conflict3 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
              );
  }
  for (local_68 = 0; local_68 < *(uint *)(in_RDI + 0x80); local_68 = local_68 + 1) {
    fVar9 = compute_weight_multiplier
                      (in_stack_ffffffffffffff60,
                       CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                       (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    for (local_78 = 0; local_78 < *(uint *)(in_RDI + 0xa8); local_78 = local_78 + 1) {
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&stack0xffffffffffffffb0,local_78
                         );
      in_stack_ffffffffffffff5c = *pvVar8 * fVar9;
      ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                          ((vector<example_*,_std::allocator<example_*>_> *)(in_RDI + 0x58),local_78
                          );
      (*ppeVar6)->weight = in_stack_ffffffffffffff5c;
    }
    in_stack_ffffffffffffff50 = LEARNER::as_multiline<char,char>(in_stack_00000100);
    LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::learn
              (in_stack_ffffffffffffff50,
               (vector<example_*,_std::allocator<example_*>_> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff40);
  }
  for (local_88 = 0; local_88 < *(uint *)(in_RDI + 0xa8); local_88 = local_88 + 1) {
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&stack0xffffffffffffffb0,local_88);
    vVar10 = *pvVar8;
    ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        ((vector<example_*,_std::allocator<example_*>_> *)(in_RDI + 0x58),local_88);
    (*ppeVar6)->weight = vVar10;
  }
  for (__n = 0; __n < *(uint *)(in_RDI + 0xa8); __n = __n + 1) {
    plVar7 = (label_t *)(*(long *)(in_RDI + 0x170) + __n * 0x20);
    ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        ((vector<example_*,_std::allocator<example_*>_> *)(in_RDI + 0x58),__n);
    peVar1 = *ppeVar6;
    (peVar1->l).multi = *plVar7;
    (peVar1->l).cs.costs._end = (wclass *)plVar7[1];
    (peVar1->l).cs.costs.end_array = (wclass *)plVar7[2];
    (peVar1->l).cs.costs.erase_count = (size_t)plVar7[3];
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff50);
  return;
}

Assistant:

void learn_sup_adf(warm_cb& data, example& ec, int ec_type)
{
	copy_example_to_adf(data, ec);
	//generate cost-sensitive label (for cost-sensitive learner's temporary use)
	auto& csls = data.csls;
	auto& cbls = data.cbls;
	for (size_t a = 0; a < data.num_actions; ++a)
	{
		csls[a].costs[0].class_index = a+1;
		if (use_cs)
			csls[a].costs[0].x = loss_cs(data, ec.l.cs.costs, a+1);
 		else
			csls[a].costs[0].x = loss(data, ec.l.multi.label, a+1);
	}
	for (size_t a = 0; a < data.num_actions; ++a)
	{
		cbls[a] = data.ecs[a]->l.cb;
		data.ecs[a]->l.cs = csls[a];
	}

	vector<float> old_weights;
	for (size_t a = 0; a < data.num_actions; ++a)
		old_weights.push_back(data.ecs[a]->weight);

	for (uint32_t i = 0; i < data.choices_lambda; i++)
	{
		float weight_multiplier = compute_weight_multiplier(data, i, ec_type);
		for (size_t a = 0; a < data.num_actions; ++a)
			data.ecs[a]->weight = old_weights[a] * weight_multiplier;
		multi_learner* cs_learner = as_multiline(data.all->cost_sensitive);
		cs_learner->learn(data.ecs, i);
	}

	for (size_t a = 0; a < data.num_actions; ++a)
		data.ecs[a]->weight = old_weights[a];

	for (size_t a = 0; a < data.num_actions; ++a)
		data.ecs[a]->l.cb = cbls[a];
}